

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeSelect(TranslateToFuzzReader *this,Type type)

{
  Type TVar1;
  Type type_00;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  
  TVar1 = getSubType(this,type);
  type_00 = getSubType(this,type);
  pEVar2 = make(this,(Type)0x2);
  pEVar3 = make(this,TVar1);
  pEVar4 = make(this,type_00);
  TVar1.id = (uintptr_t)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
  *(undefined4 *)TVar1.id = 0x11;
  *(undefined8 *)(TVar1.id + 8) = 0;
  *(Expression **)(TVar1.id + 0x20) = pEVar2;
  *(Expression **)(TVar1.id + 0x10) = pEVar3;
  *(Expression **)(TVar1.id + 0x18) = pEVar4;
  ::wasm::Select::finalize(TVar1);
  return (Expression *)TVar1.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeSelect(Type type) {
  Type subType1 = getSubType(type);
  Type subType2 = getSubType(type);
  return buildSelect({make(Type::i32), make(subType1), make(subType2)}, type);
}